

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

void Vec_WecErase(Vec_Wec_t *p)

{
  int local_14;
  int i;
  Vec_Wec_t *p_local;
  
  for (local_14 = 0; local_14 < p->nCap; local_14 = local_14 + 1) {
    if (p->pArray[local_14].pArray != (int *)0x0) {
      free(p->pArray[local_14].pArray);
      p->pArray[local_14].pArray = (int *)0x0;
    }
  }
  if (p->pArray != (Vec_Int_t *)0x0) {
    free(p->pArray);
    p->pArray = (Vec_Int_t *)0x0;
  }
  p->nSize = 0;
  p->nCap = 0;
  return;
}

Assistant:

static inline void Vec_WecErase( Vec_Wec_t * p )
{
    int i;
    for ( i = 0; i < p->nCap; i++ )
        ABC_FREE( p->pArray[i].pArray );
    ABC_FREE( p->pArray );
    p->nSize = 0;
    p->nCap = 0;
}